

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

void __thiscall MeCab::ChunkFreeList<char>::~ChunkFreeList(ChunkFreeList<char> *this)

{
  pointer ppVar1;
  char *pcVar2;
  ulong uVar3;
  
  this->_vptr_ChunkFreeList = (_func_int **)&PTR__ChunkFreeList_0016b998;
  uVar3 = 0;
  while( true ) {
    this->li_ = uVar3;
    ppVar1 = (this->freelist_).
             super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->freelist_).
                      super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <= uVar3)
    break;
    pcVar2 = ppVar1[uVar3].second;
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
      uVar3 = this->li_;
    }
    uVar3 = uVar3 + 1;
  }
  std::
  _Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
  ::~_Vector_base(&(this->freelist_).
                   super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
                 );
  return;
}

Assistant:

virtual ~ChunkFreeList() {
    for (li_ = 0; li_ < freelist_.size(); li_++)
      delete [] freelist_[li_].second;
  }